

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::_reshapeOrtho(Application *this,int width,int height)

{
  int height_local;
  int width_local;
  Application *this_local;
  
  (*glad_glMatrixMode)(0x1701);
  (*glad_glLoadIdentity)();
  (*glad_glOrtho)(0.0,(double)width,0.0,(double)height,-100.1,100.1);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glLoadIdentity)();
  (*glad_glTranslatef)(0.0,0.0,0.0);
  return;
}

Assistant:

void Application::_reshapeOrtho(int width, int height) {
    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    glOrtho(0, width, 0, height, -100.1, 100.1); // Added .1 to znear and zfar to allow using the full -100 - 100 range
    glMatrixMode(GL_MODELVIEW);
    glLoadIdentity();
    glTranslatef(0.0, 0.0, 0.0);
}